

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O2

string * __thiscall
iutest::detail::ToHexString<__int128>(string *__return_storage_ptr__,detail *this,__int128 value)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  allocator<char> local_59;
  char local_58 [48];
  
  pcVar3 = local_58;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  for (lVar4 = 0x7c; lVar4 != -4; lVar4 = lVar4 + -4) {
    bVar1 = __ashrti3(this);
    bVar1 = bVar1 & 0xf;
    cVar2 = bVar1 + 0x30;
    if (9 < bVar1) {
      cVar2 = bVar1 + 0x37;
    }
    *pcVar3 = cVar2;
    pcVar3 = pcVar3 + 1;
  }
  local_58[0x20] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_58,&local_59);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(T value)
{
    const size_t kN = sizeof(T)*2;
    char buf[kN + 1] = {0};
    for( size_t i=0; i < kN; ++i )
    {
        buf[i] = ToHex(static_cast<unsigned int>((value>>((kN-i-1)*4))));
    }
    buf[kN] = '\0';
    return buf;
}